

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipmerge.c
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  long lVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  __int32_t **pp_Var8;
  long lVar9;
  int *piVar10;
  char *pcVar11;
  char *pcVar12;
  FILE *pFVar13;
  char *pcVar14;
  uint uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  int err;
  int err_1;
  ulong local_4d8;
  ulong local_4d0;
  char **local_4c8;
  long local_4c0;
  undefined8 local_4b0;
  zip_uint64_t local_4a0;
  uint local_488;
  zip_stat st;
  zip_error_t error;
  
  progname = *argv;
  confirm = 1;
  name_flags = 0;
  while( true ) {
    while( true ) {
      while (iVar1 = getopt(argc,argv,"hVDiIsS"), iVar1 < 0x56) {
        if (iVar1 < 0x49) {
          if (iVar1 != 0x44) {
            if ((iVar1 == -1) && (lVar18 = (long)_optind, _optind + 2 <= argc)) {
              iVar1 = _optind + 1;
              pcVar12 = argv[lVar18];
              uVar15 = argc - iVar1;
              uVar17 = (ulong)uVar15;
              _optind = iVar1;
              pvVar3 = malloc(uVar17 * 8);
              if (pvVar3 == (void *)0x0) {
                fprintf(_stderr,"%s: out of memory\n",progname);
                goto LAB_00101976;
              }
              lVar4 = zip_open(pcVar12,1,&err);
              if (lVar4 == 0) {
                zip_error_init_with_code(&error,err);
                pFVar13 = _stderr;
                pcVar14 = progname;
                uVar5 = zip_error_strerror(&error);
                fprintf(pFVar13,"%s: can\'t open zip archive \'%s\': %s\n",pcVar14,pcVar12,uVar5);
                zip_error_fini(&error);
                goto LAB_00101976;
              }
              local_4d8 = uVar17;
              if (argc == iVar1) goto LAB_00101931;
              local_4d0 = (ulong)(uVar15 + (uVar15 == 0));
              local_4c8 = argv + lVar18 + 1;
              uVar17 = 0;
              goto LAB_00101506;
            }
            goto LAB_001013cb;
          }
          name_flags = name_flags | 2;
        }
        else if (iVar1 == 0x49) {
          name_flags = name_flags | 1;
        }
        else {
          if (iVar1 != 0x53) goto LAB_001013cb;
          confirm = confirm & 0xffffffcfU | 0x20;
        }
      }
      if (iVar1 < 0x73) break;
      if (iVar1 != 0x73) goto LAB_001013cb;
      confirm = confirm & 0xffffffcfU | 0x10;
    }
    if (iVar1 != 0x69) break;
    confirm = confirm & 0xfffffffe;
  }
  if (iVar1 == 0x56) {
    pcVar12 = version_string;
  }
  else {
    if (iVar1 != 0x68) {
LAB_001013cb:
      fprintf(_stderr,"usage: %s [-DhIiSsV] target-zip zip...\n",progname);
      exit(2);
    }
    fputs(help_head,_stdout);
    printf("usage: %s [-DhIiSsV] target-zip zip...\n",progname);
    pcVar12 = help;
  }
  fputs(pcVar12,_stdout);
  goto LAB_0010140a;
  while (uVar17 = uVar17 + 1, uVar17 != local_4d0) {
LAB_00101506:
    pcVar14 = local_4c8[uVar17];
    lVar18 = zip_open(pcVar14,0,&err_1);
    if (lVar18 == 0) {
      zip_error_init_with_code(&error,err_1);
      pFVar13 = _stderr;
      pcVar11 = progname;
      uVar5 = zip_error_strerror(&error);
      fprintf(pFVar13,"%s: can\'t open zip archive \'%s\': %s\n",pcVar11,pcVar14,uVar5);
      zip_error_fini(&error);
LAB_00101890:
      lVar18 = 0;
    }
    else {
      local_4c0 = zip_get_num_entries(lVar18);
      pFVar13 = _stderr;
      pcVar11 = progname;
      if (local_4c0 < 0) {
        uVar5 = zip_strerror(lVar4);
        fprintf(pFVar13,"%s: cannot get number of entries for \'%s\': %s\n",pcVar11,pcVar14,uVar5);
        goto LAB_00101890;
      }
      if (local_4c0 != 0) {
        lVar16 = 0;
        do {
          uVar5 = zip_get_name(lVar18,lVar16,0);
          lVar6 = zip_name_locate(lVar4,uVar5,name_flags);
          if (lVar6 < 0) {
            lVar6 = zip_source_zip(lVar4,lVar18,lVar16,0,0,0);
            if ((lVar6 == 0) || (lVar9 = zip_add(lVar4,uVar5,lVar6), lVar9 < 0)) {
              zip_source_free(lVar6);
              pFVar13 = _stderr;
              pcVar14 = progname;
              zip_strerror(lVar4);
              pcVar11 = "%s: cannot add \'%s\' to `%s\': %s\n";
LAB_001018f1:
              fprintf(pFVar13,pcVar11,pcVar14);
LAB_00101906:
              zip_close(lVar18);
              lVar18 = 0;
              break;
            }
          }
          else {
            uVar15 = 1;
            if ((confirm & 1U) == 0) {
              if ((confirm & 2U) == 0) {
                iVar2 = zip_stat_index(lVar4,lVar6,8,&st);
                pFVar13 = _stderr;
                pcVar11 = progname;
                if (iVar2 < 0) {
                  zip_strerror(lVar4);
LAB_001017af:
                  fprintf(pFVar13,"%s: cannot stat file %lu in \'%s\': %s\n",pcVar11);
                }
                else {
                  iVar2 = zip_stat_index(lVar18,lVar16,0);
                  pFVar13 = _stderr;
                  pcVar11 = progname;
                  if (iVar2 < 0) {
                    zip_strerror(lVar18);
                    goto LAB_001017af;
                  }
                  if (((st.size == local_4a0) && (st.crc == local_488)) &&
                     (((confirm & 0x10U) != 0 || (uVar15 = 0, (confirm & 0x20U) != 0))))
                  goto LAB_001016e6;
                  printf("replace \'%s\' (%lu / %08x) in `%s\'\n   with \'%s\' (%lu / %08x) from `%s\'? "
                         ,st.name,st.size,(ulong)st.crc,pcVar12,local_4b0,local_4a0,(ulong)local_488
                         ,pcVar14);
                  fflush(_stdout);
                  pcVar7 = fgets((char *)&error,0x400,_stdin);
                  pFVar13 = _stderr;
                  pcVar11 = progname;
                  if (pcVar7 != (char *)0x0) {
                    pp_Var8 = __ctype_tolower_loc();
                    uVar15 = (uint)((*pp_Var8)[(byte)error.zip_err] == 0x79);
                    goto LAB_001016e6;
                  }
                  piVar10 = __errno_location();
                  strerror(*piVar10);
                  fprintf(pFVar13,"%s: read error from stdin: %s\n",pcVar11);
                }
                uVar15 = 0xffffffff;
              }
              else {
                uVar15 = 0;
              }
            }
LAB_001016e6:
            if (uVar15 != 0) {
              if (uVar15 != 1) goto LAB_00101906;
              lVar9 = zip_source_zip(lVar4,lVar18,lVar16,0,0,0);
              if ((lVar9 == 0) || (iVar2 = zip_replace(lVar4,lVar6,lVar9), iVar2 < 0)) {
                zip_source_free(lVar9);
                pFVar13 = _stderr;
                pcVar14 = progname;
                zip_strerror(lVar4);
                pcVar11 = "%s: cannot replace \'%s\' in `%s\': %s\n";
                goto LAB_001018f1;
              }
            }
          }
          lVar16 = lVar16 + 1;
        } while (local_4c0 != lVar16);
      }
    }
    *(long *)((long)pvVar3 + uVar17 * 8) = lVar18;
    if (lVar18 == 0) goto LAB_00101976;
  }
LAB_00101931:
  iVar2 = zip_close();
  pFVar13 = _stderr;
  pcVar14 = progname;
  if (-1 < iVar2) {
    if (argc != iVar1) {
      iVar1 = (int)local_4d8;
      uVar17 = 0;
      do {
        zip_close();
        uVar17 = uVar17 + 1;
      } while (iVar1 + (uint)(iVar1 == 0) != uVar17);
    }
LAB_0010140a:
    exit(0);
  }
  uVar5 = zip_strerror(lVar4);
  fprintf(pFVar13,"%s: cannot write zip archive \'%s\': %s\n",pcVar14,pcVar12,uVar5);
LAB_00101976:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[]) {
    zip_t *za;
    zip_t **zs;
    int c, err;
    unsigned int i, n;
    char *tname;

    progname = argv[0];

    confirm = CONFIRM_ALL_YES;
    name_flags = 0;

    while ((c = getopt(argc, argv, OPTIONS)) != -1) {
	switch (c) {
	case 'D':
	    name_flags |= ZIP_FL_NODIR;
	    break;
	case 'i':
	    confirm &= ~CONFIRM_ALL_YES;
	    break;
	case 'I':
	    name_flags |= ZIP_FL_NOCASE;
	    break;
	case 's':
	    confirm &= ~CONFIRM_SAME_NO;
	    confirm |= CONFIRM_SAME_YES;
	    break;
	case 'S':
	    confirm &= ~CONFIRM_SAME_YES;
	    confirm |= CONFIRM_SAME_NO;
	    break;

	case 'h':
	    fputs(help_head, stdout);
	    printf(USAGE, progname);
	    fputs(help, stdout);
	    exit(0);
	case 'V':
	    fputs(version_string, stdout);
	    exit(0);

	default:
	    fprintf(stderr, USAGE, progname);
	    exit(2);
	}
    }

    if (argc < optind + 2) {
	fprintf(stderr, USAGE, progname);
	exit(2);
    }

    tname = argv[optind++];
    argv += optind;

    n = (unsigned int)(argc - optind);
    if ((zs = (zip_t **)malloc(sizeof(zs[0]) * n)) == NULL) {
	fprintf(stderr, "%s: out of memory\n", progname);
	exit(1);
    }

    if ((za = zip_open(tname, ZIP_CREATE, &err)) == NULL) {
	zip_error_t error;
	zip_error_init_with_code(&error, err);
	fprintf(stderr, "%s: can't open zip archive '%s': %s\n", progname, tname, zip_error_strerror(&error));
	zip_error_fini(&error);
	exit(1);
    }

    for (i = 0; i < n; i++) {
	if ((zs[i] = merge_zip(za, tname, argv[i])) == NULL)
	    exit(1);
    }

    if (zip_close(za) < 0) {
	fprintf(stderr, "%s: cannot write zip archive '%s': %s\n", progname, tname, zip_strerror(za));
	exit(1);
    }

    for (i = 0; i < n; i++)
	zip_close(zs[i]);

    exit(0);
}